

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

Offset<reflection::Field> __thiscall
flatbuffers::FieldDef::Serialize
          (FieldDef *this,FlatBufferBuilder *builder,uint16_t id,Parser *parser)

{
  uint16_t offset;
  Offset<flatbuffers::String> name;
  Offset<reflection::Type> type;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attributes;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> documentation
  ;
  BaseType BVar1;
  Offset<reflection::Field> OVar2;
  int64_t default_integer;
  double d;
  
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,(string *)this);
  type = Type::Serialize(&(this->value).type,builder);
  attributes = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  documentation.o = 0;
  if (((parser->opts).binary_schema_comments == true) &&
     ((this->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    documentation =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (builder,&(this->super_Definition).doc_comment);
  }
  StringToFloatImpl<double>(&d,(this->value).constant._M_dataplus._M_p);
  offset = (this->value).offset;
  BVar1 = (this->value).type.base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 10) {
    default_integer = StringToInt((this->value).constant._M_dataplus._M_p,10);
    BVar1 = (this->value).type.base_type;
  }
  else {
    default_integer = 0;
  }
  if (1 < BVar1 - BASE_TYPE_FLOAT) {
    d = 0.0;
  }
  OVar2 = reflection::CreateField
                    (builder,name,type,id,offset,default_integer,d,this->deprecated,
                     this->presence == kRequired,this->key,attributes,documentation,
                     this->presence == kOptional,(uint16_t)this->padding,this->offset64);
  return (Offset<reflection::Field>)OVar2.o;
}

Assistant:

Offset<reflection::Field> FieldDef::Serialize(FlatBufferBuilder *builder,
                                              uint16_t id,
                                              const Parser &parser) const {
  auto name__ = builder->CreateString(name);
  auto type__ = value.type.Serialize(builder);
  auto attr__ = SerializeAttributes(builder, parser);
  auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                    ? builder->CreateVectorOfStrings(doc_comment)
                    : 0;
  double d;
  StringToNumber(value.constant.c_str(), &d);
  return reflection::CreateField(
      *builder, name__, type__, id, value.offset,
      // Is uint64>max(int64) tested?
      IsInteger(value.type.base_type) ? StringToInt(value.constant.c_str()) : 0,
      // result may be platform-dependent if underlying is float (not double)
      IsFloat(value.type.base_type) ? d : 0.0, deprecated, IsRequired(), key,
      attr__, docs__, IsOptional(), static_cast<uint16_t>(padding), offset64);
  // TODO: value.constant is almost always "0", we could save quite a bit of
  // space by sharing it. Same for common values of value.type.
}